

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trace_impl.cc
# Opt level: O0

TraceImpl * webrtc::TraceImpl::StaticInstance(CountOperation count_operation,TraceLevel level)

{
  TraceLevel TVar1;
  TraceImpl *impl;
  TraceLevel level_local;
  CountOperation count_operation_local;
  
  if (((level == kTraceAll) || (count_operation != kAddRefNoCreate)) ||
     (TVar1 = Trace::level_filter(), (level & TVar1) != kTraceNone)) {
    _level_local = GetStaticInstance<webrtc::TraceImpl>(count_operation);
  }
  else {
    _level_local = (TraceImpl *)0x0;
  }
  return _level_local;
}

Assistant:

TraceImpl* TraceImpl::StaticInstance(CountOperation count_operation,
                                     const TraceLevel level) {
  // Sanities to avoid taking lock unless absolutely necessary (for
  // performance reasons). count_operation == kAddRefNoCreate implies that a
  // message will be written to file.
  if ((level != kTraceAll) && (count_operation == kAddRefNoCreate)) {
    if (!(level & level_filter())) {
      return NULL;
    }
  }
  TraceImpl* impl =
    GetStaticInstance<TraceImpl>(count_operation);
  return impl;
}